

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRunner.cpp
# Opt level: O2

void __thiscall
UnitTest::TestRunner::RunTest
          (TestRunner *this,TestResults *result,Test *curTest,int maxTestTimeInMs)

{
  TestDetails *test;
  TestResults **ppTVar1;
  ostream *poVar2;
  char *failure;
  double dVar3;
  Timer testTimer;
  MemoryOutStream stream;
  Timer local_1d0;
  MemoryOutStream local_1c0;
  
  ppTVar1 = CurrentTest::Results();
  *ppTVar1 = result;
  Timer::Timer(&local_1d0);
  Timer::Start(&local_1d0);
  test = &curTest->m_details;
  TestResults::OnTestStart(result,test);
  Test::Run(curTest);
  dVar3 = Timer::GetTimeInMs(&local_1d0);
  if (((0 < maxTestTimeInMs) && ((double)maxTestTimeInMs < dVar3)) &&
     (curTest->m_timeConstraintExempt == false)) {
    MemoryOutStream::MemoryOutStream(&local_1c0);
    poVar2 = std::operator<<((ostream *)&local_1c0,"Global time constraint failed. Expected under ")
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,maxTestTimeInMs);
    std::operator<<(poVar2,"ms but took ");
    poVar2 = std::ostream::_M_insert<double>(dVar3);
    std::operator<<(poVar2,"ms.");
    failure = MemoryOutStream::GetText(&local_1c0);
    TestResults::OnTestFailure(result,test,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c0);
  }
  TestResults::OnTestFinish(result,test,(float)(dVar3 / 1000.0));
  return;
}

Assistant:

void TestRunner::RunTest(TestResults* const result, Test* const curTest, int const maxTestTimeInMs) const
{
	CurrentTest::Results() = result;

	Timer testTimer;
	testTimer.Start();

	result->OnTestStart(curTest->m_details);

	curTest->Run();

	double const testTimeInMs = testTimer.GetTimeInMs();
	if (maxTestTimeInMs > 0 && testTimeInMs > maxTestTimeInMs && !curTest->m_timeConstraintExempt)
	{
	    MemoryOutStream stream;
	    stream << "Global time constraint failed. Expected under " << maxTestTimeInMs <<
	            "ms but took " << testTimeInMs << "ms.";

	    result->OnTestFailure(curTest->m_details, stream.GetText());
	}

	result->OnTestFinish(curTest->m_details, static_cast<float>(testTimeInMs/1000.0));
}